

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O1

void __thiscall InstructionGenerator::genGoto(InstructionGenerator *this,uint pos)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  iterator iVar1;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_01;
  uint local_10 [2];
  
  this_00 = this->bytecode;
  local_10[1] = 5;
  iVar1._M_current =
       (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_10[0] = pos;
  if (iVar1._M_current ==
      (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<Instruction>
              (this_00,iVar1,(Instruction *)(local_10 + 1));
  }
  else {
    *iVar1._M_current = 5;
    (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  this_01 = (vector<unsigned_int,std::allocator<unsigned_int>> *)this->bytecode;
  iVar1._M_current = *(uint **)(this_01 + 8);
  if (iVar1._M_current == *(uint **)(this_01 + 0x10)) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int&>
              (this_01,iVar1,local_10);
  }
  else {
    *iVar1._M_current = local_10[0];
    *(uint **)(this_01 + 8) = iVar1._M_current + 1;
  }
  return;
}

Assistant:

void InstructionGenerator::genGoto(unsigned int pos)
{
    bytecode->emplace_back(Instruction::GOTO);
    bytecode->emplace_back(pos);
}